

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_gamma_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int iVar2;
  uint local_48;
  int local_44;
  int val;
  int nz;
  int n;
  int i;
  int32_t *out_i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  nz = 0;
  iVar1 = *out_size;
  for (; nz < iVar1; nz = nz + 1) {
    local_44 = get_zero_bits_MSB(in);
    local_48 = 1;
    for (; 0 < local_44; local_44 = local_44 + -1) {
      local_48 = (int)(uint)in->data[in->byte] >> ((byte)in->bit & 0x1f) & 1U | local_48 << 1;
      iVar2 = in->bit + -1;
      in->bit = iVar2;
      in->byte = (long)(int)(uint)(iVar2 < 0) + in->byte;
      in->bit = in->bit & 7;
    }
    *(uint *)(out + (long)nz * 4) = local_48 - (c->field_6).huffman.ncodes;
  }
  return 0;
}

Assistant:

int cram_gamma_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    for (i = 0, n = *out_size; i < n; i++) {
	int nz = 0;
	int val;
	//while (get_bit_MSB(in) == 0) nz++;
	nz = get_zero_bits_MSB(in);
	val = 1;
	while (nz > 0) {
	    //val <<= 1; val |= get_bit_MSB(in);
	    GET_BIT_MSB(in, val);
	    nz--;
	}

	out_i[i] = val - c->gamma.offset;
    }

    return 0;
}